

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaGetEffectiveValueConstraint
              (xmlSchemaAttributeUsePtr_conflict attruse,int *fixed,xmlChar **value,
              xmlSchemaValPtr *val)

{
  xmlSchemaValPtr *val_local;
  xmlChar **value_local;
  int *fixed_local;
  xmlSchemaAttributeUsePtr_conflict attruse_local;
  
  *fixed = 0;
  *value = (xmlChar *)0x0;
  if (val != (xmlSchemaValPtr *)0x0) {
    *val = (xmlSchemaValPtr)0x0;
  }
  if (attruse->defValue == (xmlChar *)0x0) {
    if ((attruse->attrDecl == (xmlSchemaAttributePtr)0x0) ||
       (attruse->attrDecl->defValue == (xmlChar *)0x0)) {
      attruse_local._4_4_ = 0;
    }
    else {
      *value = attruse->attrDecl->defValue;
      if (val != (xmlSchemaValPtr *)0x0) {
        *val = attruse->attrDecl->defVal;
      }
      if ((attruse->attrDecl->flags & 0x200U) != 0) {
        *fixed = 1;
      }
      attruse_local._4_4_ = 1;
    }
  }
  else {
    *value = attruse->defValue;
    if (val != (xmlSchemaValPtr *)0x0) {
      *val = attruse->defVal;
    }
    if ((attruse->flags & 1U) != 0) {
      *fixed = 1;
    }
    attruse_local._4_4_ = 1;
  }
  return attruse_local._4_4_;
}

Assistant:

static int
xmlSchemaGetEffectiveValueConstraint(xmlSchemaAttributeUsePtr attruse,
				     int *fixed,
				     const xmlChar **value,
				     xmlSchemaValPtr *val)
{
    *fixed = 0;
    *value = NULL;
    if (val != 0)
	*val = NULL;

    if (attruse->defValue != NULL) {
	*value = attruse->defValue;
	if (val != NULL)
	    *val = attruse->defVal;
	if (attruse->flags & XML_SCHEMA_ATTR_USE_FIXED)
	    *fixed = 1;
	return(1);
    } else if ((attruse->attrDecl != NULL) &&
	(attruse->attrDecl->defValue != NULL)) {
	*value = attruse->attrDecl->defValue;
	if (val != NULL)
	    *val = attruse->attrDecl->defVal;
	if (attruse->attrDecl->flags & XML_SCHEMAS_ATTR_FIXED)
	    *fixed = 1;
	return(1);
    }
    return(0);
}